

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::NodeHelper_OpenNode
          (X3DExporter *this,string *pNodeName,size_t pTabLevel,bool pEmptyElement,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pAttrList)

{
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *this_00;
  bool bVar1;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  reference local_80;
  SAttribute *attr;
  const_iterator __end1;
  const_iterator __begin1;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *local_30;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *pAttrList_local;
  size_t sStack_20;
  bool pEmptyElement_local;
  size_t pTabLevel_local;
  string *pNodeName_local;
  X3DExporter *this_local;
  
  local_30 = pAttrList;
  pAttrList_local._7_1_ = pEmptyElement;
  sStack_20 = pTabLevel;
  pTabLevel_local = (size_t)pNodeName;
  pNodeName_local = (string *)this;
  IndentationStringSet(this,pTabLevel);
  XML_Write(this,&this->mIndentationString);
  std::operator+(&local_50,"<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pTabLevel_local);
  XML_Write(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = local_30;
  __end1 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           begin(local_30);
  attr = (SAttribute *)
         std::__cxx11::
         list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
         end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&attr);
    if (!bVar1) break;
    local_80 = std::_List_const_iterator<Assimp::X3DExporter::SAttribute>::operator*(&__end1);
    std::operator+(&local_100," ",&local_80->Name);
    std::operator+(&local_e0,&local_100,"=\'");
    std::operator+(&local_c0,&local_e0,&local_80->Value);
    std::operator+(&local_a0,&local_c0,"\'");
    XML_Write(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::_List_const_iterator<Assimp::X3DExporter::SAttribute>::operator++(&__end1);
  }
  if ((pAttrList_local._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,">\n",&local_149);
    XML_Write(this,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"/>\n",&local_121);
    XML_Write(this,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  return;
}

Assistant:

void X3DExporter::NodeHelper_OpenNode(const string& pNodeName, const size_t pTabLevel, const bool pEmptyElement, const list<SAttribute>& pAttrList)
{
	// Write indentation.
	IndentationStringSet(pTabLevel);
	XML_Write(mIndentationString);
	// Begin of the element
	XML_Write("<" + pNodeName);
	// Write attributes
	for(const SAttribute& attr: pAttrList) { XML_Write(" " + attr.Name + "='" + attr.Value + "'"); }

	// End of the element
	if(pEmptyElement)
	{
		XML_Write("/>\n");
	}
	else
	{
		XML_Write(">\n");
	}
}